

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeevents.cpp
# Opt level: O0

void __thiscall YAML::NodeEvents::Setup(NodeEvents *this,node *node)

{
  bool bVar1;
  value vVar2;
  node *node_00;
  NodeEvents *in_RSI;
  node *in_RDI;
  value_type element_1;
  const_node_iterator __end3;
  const_node_iterator __begin3;
  node *__range3;
  value_type element;
  const_node_iterator __end2;
  const_node_iterator __begin2;
  node *__range2;
  int *refCount;
  node_iterator_base<const_YAML::detail::node> *in_stack_ffffffffffffff08;
  node_iterator_base<const_YAML::detail::node> *in_stack_ffffffffffffff20;
  node_iterator_base<const_YAML::detail::node> *in_stack_ffffffffffffff30;
  key_type *in_stack_ffffffffffffff48;
  map<const_YAML::detail::node_ref_*,_int,_std::less<const_YAML::detail::node_ref_*>,_std::allocator<std::pair<const_YAML::detail::node_ref_*const,_int>_>_>
  *in_stack_ffffffffffffff50;
  node_iterator_value<const_YAML::detail::node> local_80 [4];
  node_ref *local_20;
  
  local_20 = detail::node::ref((node *)0xf0e49a);
  node_00 = (node *)std::
                    map<const_YAML::detail::node_ref_*,_int,_std::less<const_YAML::detail::node_ref_*>,_std::allocator<std::pair<const_YAML::detail::node_ref_*const,_int>_>_>
                    ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  *(int *)&(node_00->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr =
       *(int *)&(node_00->m_pRef).
                super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
  if (*(int *)&(node_00->m_pRef).
               super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr < 2) {
    vVar2 = detail::node::type((node *)0xf0e4ea);
    if (vVar2 == Sequence) {
      detail::node::begin(in_RDI);
      detail::node::end(in_RDI);
      while (bVar1 = detail::node_iterator_base<YAML::detail::node_const>::operator!=
                               ((node_iterator_base<const_YAML::detail::node> *)in_RDI,
                                in_stack_ffffffffffffff08), bVar1) {
        detail::node_iterator_base<const_YAML::detail::node>::operator*(in_stack_ffffffffffffff30);
        detail::node_iterator_value<const_YAML::detail::node>::operator*(local_80);
        Setup(in_RSI,node_00);
        detail::node_iterator_base<const_YAML::detail::node>::operator++(in_stack_ffffffffffffff20);
      }
    }
    else {
      vVar2 = detail::node::type((node *)0xf0e592);
      if (vVar2 == Map) {
        detail::node::begin(in_RDI);
        detail::node::end(in_RDI);
        while (bVar1 = detail::node_iterator_base<YAML::detail::node_const>::operator!=
                                 ((node_iterator_base<const_YAML::detail::node> *)in_RDI,
                                  in_stack_ffffffffffffff08), bVar1) {
          detail::node_iterator_base<const_YAML::detail::node>::operator*(in_stack_ffffffffffffff30)
          ;
          Setup(in_RSI,node_00);
          Setup(in_RSI,node_00);
          detail::node_iterator_base<const_YAML::detail::node>::operator++
                    (in_stack_ffffffffffffff20);
        }
      }
    }
  }
  return;
}

Assistant:

void NodeEvents::Setup(const detail::node& node) {
  int& refCount = m_refCount[node.ref()];
  refCount++;
  if (refCount > 1)
    return;

  if (node.type() == NodeType::Sequence) {
    for (auto element : node)
      Setup(*element);
  } else if (node.type() == NodeType::Map) {
    for (auto element : node) {
      Setup(*element.first);
      Setup(*element.second);
    }
  }
}